

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

int __thiscall fmt::v11::parse_context<char>::next_arg_id(parse_context<char> *this)

{
  int arg_id;
  parse_context<char> *in_RDI;
  char *unaff_retaddr;
  int id;
  
  if (in_RDI->next_arg_id_ < 0) {
    report_error(unaff_retaddr);
  }
  arg_id = in_RDI->next_arg_id_;
  in_RDI->next_arg_id_ = arg_id + 1;
  do_check_arg_id(in_RDI,arg_id);
  return arg_id;
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    if (next_arg_id_ < 0) {
      report_error("cannot switch from manual to automatic argument indexing");
      return 0;
    }
    int id = next_arg_id_++;
    do_check_arg_id(id);
    return id;
  }